

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O0

void __thiscall
COLLADASaxFWL::KinematicsScene::KinematicsScene(KinematicsScene *this,URI *uri,String *name)

{
  string *in_RDX;
  undefined8 *in_RDI;
  bool in_stack_00000057;
  URI *in_stack_00000058;
  URI *in_stack_00000060;
  IntermediateTargetableTemplate<6UL> *in_stack_ffffffffffffffd0;
  
  IntermediateTargetableTemplate<6UL>::IntermediateTargetableTemplate(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__KinematicsScene_00db3f40;
  COLLADABU::URI::URI(in_stack_00000060,in_stack_00000058,in_stack_00000057);
  std::__cxx11::string::string((string *)(in_RDI + 0x1e),in_RDX);
  std::
  vector<COLLADASaxFWL::KinematicsInstanceArticulatedSystem_*,_std::allocator<COLLADASaxFWL::KinematicsInstanceArticulatedSystem_*>_>
  ::vector((vector<COLLADASaxFWL::KinematicsInstanceArticulatedSystem_*,_std::allocator<COLLADASaxFWL::KinematicsInstanceArticulatedSystem_*>_>
            *)0xc3ed71);
  std::__cxx11::
  list<COLLADASaxFWL::KinematicsInstanceKinematicsModel,_std::allocator<COLLADASaxFWL::KinematicsInstanceKinematicsModel>_>
  ::list((list<COLLADASaxFWL::KinematicsInstanceKinematicsModel,_std::allocator<COLLADASaxFWL::KinematicsInstanceKinematicsModel>_>
          *)0xc3ed81);
  return;
}

Assistant:

KinematicsScene(const COLLADABU::URI& uri, const String& name )
			: mUri( uri ), mName(name) {}